

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::ClearAttribute
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,PropertyIndex index,
          PropertyAttributes attribute)

{
  code *pcVar1;
  bool bVar2;
  byte attributes_00;
  PropertyId propertyId;
  undefined4 *puVar3;
  DynamicType *type;
  PathTypeHandlerBase *this_00;
  PropertyRecord *this_01;
  SimpleTypeHandler<3UL> *pSVar4;
  DynamicType *pDVar5;
  DynamicType *oldType;
  PropertyAttributes attributes;
  PropertyAttributes attribute_local;
  PropertyIndex index_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<3UL> *this_local;
  
  if ((this->descriptors[index].field_1.Attributes & 8) == 0) {
    attributes_00 = this->descriptors[index].field_1.Attributes & (attribute ^ 0xff);
    if (attributes_00 == this->descriptors[index].field_1.Attributes) {
      this_local._4_4_ = 0;
    }
    else {
      bVar2 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
      if (bVar2) {
        type = DynamicObject::GetDynamicType(instance);
        bVar2 = DoConvertToPathType(type);
        if (bVar2) {
          this_00 = ConvertToPathType(this,instance);
          this_01 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                              (&this->descriptors[index].Id);
          propertyId = PropertyRecord::GetPropertyId(this_01);
          PathTypeHandlerBase::SetAttributesAtIndex(this_00,instance,propertyId,index,attributes_00)
          ;
        }
        else {
          pSVar4 = ConvertToNonSharedSimpleType(this,instance);
          pSVar4->descriptors[index].field_1.Attributes = attributes_00;
        }
        bVar2 = DynamicType::GetIsLocked(type);
        if ((bVar2) && (pDVar5 = DynamicObject::GetDynamicType(instance), pDVar5 == type)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                      ,0x3bd,
                                      "(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType)"
                                      ,
                                      "!oldType->GetIsLocked() || instance->GetDynamicType() != oldType"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
      }
      else {
        this->descriptors[index].field_1.Attributes = attributes_00;
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    bVar2 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x3a2,"(!GetIsLocked())","!GetIsLocked()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleTypeHandler<size>::ClearAttribute(DynamicObject* instance, PropertyIndex index, PropertyAttributes attribute)
    {
        if (descriptors[index].Attributes & PropertyDeleted)
        {
            // A locked type should not have deleted properties
            Assert(!GetIsLocked());
            return false;
        }

        PropertyAttributes attributes = descriptors[index].Attributes;
        attributes &= ~attribute;
        if (attributes == descriptors[index].Attributes)
        {
            return false;
        }

        // If the type is locked we must force type transition to invalidate any potential property string
        // caches used in snapshot enumeration.
        if (GetIsLocked())
        {
            DynamicType* oldType = instance->GetDynamicType();

            // This changes TypeHandler, but not necessarily Type.
            if (DoConvertToPathType(oldType))
            {
                this->ConvertToPathType(instance)->SetAttributesAtIndex(instance, descriptors[index].Id->GetPropertyId(), index, attributes);
            }
            else
            {
                // Don't attempt to share cross-site function types
                this->ConvertToNonSharedSimpleType(instance)->descriptors[index].Attributes = attributes;
            }
            Assert(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType);
        }
        else
        {
            descriptors[index].Attributes = attributes;
        }
        return true;
    }